

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspect.c
# Opt level: O3

void duckdb_je_inspect_extent_util_stats_verbose_get
               (tsdn_t *tsdn,void *ptr,size_t *nfree,size_t *nregs,size_t *size,size_t *bin_nfree,
               size_t *bin_nregs,void **slabcur_addr)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  malloc_mutex_t *mutex;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  ulong *puVar9;
  ulong uVar10;
  size_t sVar11;
  edata_t *peVar12;
  void *pvVar13;
  uint uVar14;
  ulong uVar15;
  mutex_prof_data_t *data;
  rtree_ctx_t *ctx;
  rtree_leaf_elm_t *prVar16;
  long lVar17;
  pthread_mutex_t *__mutex;
  rtree_ctx_t local_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar15 = (ulong)ptr & 0xffffffffc0000000;
  uVar10 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar9 = (ulong *)((long)&ctx->cache[0].leafkey + uVar10);
  uVar10 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar10);
  if (uVar10 == uVar15) {
    prVar16 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar9[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar15) {
    prVar16 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar10;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar9[1];
    *puVar9 = uVar15;
    puVar9[1] = (ulong)prVar16;
    prVar16 = (rtree_leaf_elm_t *)
              ((long)&(prVar16->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    lVar17 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar17 + -8) == uVar15) {
        uVar5 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar17);
        puVar3 = (undefined8 *)((long)ctx->cache + lVar17 + -0x18);
        uVar6 = puVar3[1];
        puVar4 = (undefined8 *)((long)ctx->cache + lVar17 + -8);
        *puVar4 = *puVar3;
        puVar4[1] = uVar6;
        *(ulong *)((long)ctx->cache + lVar17 + -0x18) = uVar10;
        *(ulong *)((long)(ctx->cache + -1) + lVar17) = puVar9[1];
        *puVar9 = uVar15;
        puVar9[1] = uVar5;
        prVar16 = (rtree_leaf_elm_t *)(((uint)ptr >> 9 & 0x1ffff8) + uVar5);
        goto LAB_01179f7c;
      }
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0x188);
    prVar16 = duckdb_je_rtree_leaf_elm_lookup_hard
                        (tsdn,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,false);
  }
LAB_01179f7c:
  puVar9 = (ulong *)(((long)(prVar16->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  if (puVar9 == (ulong *)0x0) {
    *bin_nregs = 0;
    *bin_nfree = 0;
    *size = 0;
    *nregs = 0;
    *nfree = 0;
  }
  else {
    *size = puVar9[2] & 0xfffffffffffff000;
    if (((uint)*puVar9 >> 0xc & 1) != 0) {
      *nfree = (ulong)((uint)(*puVar9 >> 0x1c) & 0x3ff);
      uVar14 = (uint)*puVar9 >> 0x14 & 0xff;
      *nregs = (ulong)duckdb_je_bin_infos[uVar14].nregs;
      uVar7 = (uint)(*puVar9 >> 0x26) & 0x3f;
      uVar10 = (ulong)(uVar7 << 8);
      if (uVar14 < duckdb_je_bin_info_nbatched_sizes) {
        uVar10 = (ulong)uVar7 * 0x288;
      }
      mutex = (malloc_mutex_t *)
              ((long)duckdb_je_arenas[(uint)*puVar9 & 0xfff].repr +
              uVar10 + duckdb_je_arena_bin_offsets[uVar14]);
      __mutex = (pthread_mutex_t *)
                ((long)duckdb_je_arenas[(uint)*puVar9 & 0xfff].repr +
                uVar10 + duckdb_je_arena_bin_offsets[uVar14] + 0x48);
      iVar8 = pthread_mutex_trylock(__mutex);
      if (iVar8 != 0) {
        duckdb_je_malloc_mutex_lock_slow(mutex);
        (mutex->field_0).field_0.locked.repr = true;
      }
      puVar1 = &(mutex->field_0).field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if ((mutex->field_0).field_0.prof_data.prev_owner != tsdn) {
        (mutex->field_0).field_0.prof_data.prev_owner = tsdn;
        ppwVar2 = &(mutex->field_0).witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      sVar11 = *(long *)((long)&mutex[1].field_0 + 0x40) * *nregs;
      *bin_nregs = sVar11;
      *bin_nfree = sVar11 - (long)mutex[1].field_0.witness.opaque;
      peVar12 = (edata_t *)mutex[2].field_0.witness.name;
      if ((peVar12 == (edata_t *)0x0) &&
         (peVar12 = duckdb_je_edata_heap_first
                              ((edata_heap_t *)&mutex[2].field_0.field_0.prof_data.max_wait_time),
         peVar12 == (edata_t *)0x0)) {
        pvVar13 = (void *)0x0;
      }
      else {
        pvVar13 = peVar12->e_addr;
      }
      *slabcur_addr = pvVar13;
      (mutex->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
      return;
    }
    *bin_nregs = 0;
    *bin_nfree = 0;
    *nfree = 0;
    *nregs = 1;
  }
  *slabcur_addr = (void *)0x0;
  return;
}

Assistant:

void
inspect_extent_util_stats_verbose_get(tsdn_t *tsdn, const void *ptr,
    size_t *nfree, size_t *nregs, size_t *size, size_t *bin_nfree,
    size_t *bin_nregs, void **slabcur_addr) {
	assert(ptr != NULL && nfree != NULL && nregs != NULL && size != NULL
	    && bin_nfree != NULL && bin_nregs != NULL && slabcur_addr != NULL);

	const edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	if (unlikely(edata == NULL)) {
		*nfree = *nregs = *size = *bin_nfree = *bin_nregs = 0;
		*slabcur_addr = NULL;
		return;
	}

	*size = edata_size_get(edata);
	if (!edata_slab_get(edata)) {
		*nfree = *bin_nfree = *bin_nregs = 0;
		*nregs = 1;
		*slabcur_addr = NULL;
		return;
	}

	*nfree = edata_nfree_get(edata);
	const szind_t szind = edata_szind_get(edata);
	*nregs = bin_infos[szind].nregs;
	assert(*nfree <= *nregs);
	assert(*nfree * edata_usize_get(edata) <= *size);

	arena_t *arena = (arena_t *)atomic_load_p(
	    &arenas[edata_arena_ind_get(edata)], ATOMIC_RELAXED);
	assert(arena != NULL);
	const unsigned binshard = edata_binshard_get(edata);
	bin_t *bin = arena_get_bin(arena, szind, binshard);

	malloc_mutex_lock(tsdn, &bin->lock);
	if (config_stats) {
		*bin_nregs = *nregs * bin->stats.curslabs;
		assert(*bin_nregs >= bin->stats.curregs);
		*bin_nfree = *bin_nregs - bin->stats.curregs;
	} else {
		*bin_nfree = *bin_nregs = 0;
	}
	edata_t *slab;
	if (bin->slabcur != NULL) {
		slab = bin->slabcur;
	} else {
		slab = edata_heap_first(&bin->slabs_nonfull);
	}
	*slabcur_addr = slab != NULL ? edata_addr_get(slab) : NULL;
	malloc_mutex_unlock(tsdn, &bin->lock);
}